

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.cpp
# Opt level: O3

unsigned_long dlib::impl::default_num_threads(void)

{
  uint uVar1;
  char *__s;
  unsigned_long uVar2;
  allocator<char> local_31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __s = getenv("DLIB_NUM_THREADS");
  if (__s == (char *)0x0) {
    uVar1 = std::thread::hardware_concurrency();
    uVar2 = (unsigned_long)uVar1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,__s,&local_31);
    uVar2 = string_cast_helper<unsigned_long>::
            cast<char,std::char_traits<char>,std::allocator<char>>(&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return uVar2;
}

Assistant:

unsigned long default_num_threads()
        {
            try
            {
                char* nt = getenv("DLIB_NUM_THREADS");
                if (nt)
                    return string_cast<unsigned long>(nt);
            } catch(string_cast_error&) {}
            return std::thread::hardware_concurrency();
        }